

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O0

bool __thiscall
ON_AerialPhotoImage::GetViewProjection
          (ON_AerialPhotoImage *this,ON_BoundingBox target_bbox,ON_Viewport *viewport)

{
  int port_right;
  int port_top;
  double x;
  bool bVar1;
  ON_AerialPhotoImageFrustum *this_00;
  ON_AerialPhotoCameraPosition *this_01;
  double max_frus_far;
  double s;
  double local_458;
  double bbox_far;
  double bbox_near;
  ON_3dPoint local_430;
  undefined1 local_418 [8];
  ON_Viewport vp;
  ulong uStack_1c8;
  bool rc;
  size_t i;
  double frus_top;
  double frus_bottom;
  double frus_right;
  double frus_left;
  double frus_far;
  double frus_near;
  double local_178;
  double frustum_to_position_unit_scale;
  undefined4 local_15c;
  undefined1 auStack_158 [8];
  ON_Plane camera_plane;
  undefined1 local_d0 [8];
  ON_Xform camera_rotation;
  ON_3dPoint camera_location;
  ON_AerialPhotoCameraPosition *pg_cp;
  ON_AerialPhotoImageFrustum *pg_if;
  int image_height_pixels;
  int image_width_pixels;
  ON_Viewport *viewport_local;
  ON_AerialPhotoImage *this_local;
  
  ON_Viewport::operator=(viewport,&ON_Viewport::DefaultTopViewYUp);
  bVar1 = ImageSizeIsSet(this);
  if (!bVar1) {
    return false;
  }
  port_right = this->m_image_width_pixels;
  port_top = this->m_image_height_pixels;
  this_00 = &this->m_image_frustum;
  bVar1 = ON_AerialPhotoImageFrustum::IsSet(this_00);
  if (!bVar1) {
    return false;
  }
  this_01 = &this->m_camera_position;
  bVar1 = ON_AerialPhotoCameraPosition::LocationIsSet(this_01);
  if (!bVar1) {
    return false;
  }
  bVar1 = ON_AerialPhotoCameraPosition::OrientationIsSet(this_01);
  if (!bVar1) {
    return false;
  }
  bVar1 = ON_AerialPhotoCameraPosition::GetLocation
                    (this_01,(ON_3dPoint *)(camera_rotation.m_xform[3] + 3));
  if ((!bVar1) ||
     (bVar1 = ON_3dPoint::IsValid((ON_3dPoint *)(camera_rotation.m_xform[3] + 3)), !bVar1)) {
    return false;
  }
  ON_Xform::ON_Xform((ON_Xform *)local_d0);
  bVar1 = ON_AerialPhotoCameraPosition::GetOrientationRotation(this_01,(ON_Xform *)local_d0);
  if ((!bVar1) || (bVar1 = ON_Xform::IsValid((ON_Xform *)local_d0), !bVar1)) {
    return false;
  }
  ON_Plane::ON_Plane((ON_Plane *)auStack_158);
  bVar1 = ON_AerialPhotoCameraPosition::GetOrientationFrame
                    (this_01,(ON_3dVector *)&camera_plane.origin.z,
                     (ON_3dVector *)&camera_plane.xaxis.z,(ON_3dVector *)&camera_plane.yaxis.z);
  if (!bVar1) {
    this_local._7_1_ = false;
    local_15c = 1;
    goto LAB_007c3686;
  }
  auStack_158 = (undefined1  [8])camera_rotation.m_xform[3][3];
  ON_Plane::UpdateEquation((ON_Plane *)auStack_158);
  ON_AerialPhotoCameraPosition::UnitSystem((ON_UnitSystem *)&frus_near,this_01);
  x = ON::UnitScale(&this_00->m_unit_system,(ON_UnitSystem *)&frus_near);
  ON_UnitSystem::~ON_UnitSystem((ON_UnitSystem *)&frus_near);
  local_178 = x;
  bVar1 = ON_IsValid(x);
  if ((!bVar1) || (local_178 <= 0.0)) {
    this_local._7_1_ = false;
    local_15c = 1;
    goto LAB_007c3686;
  }
  frus_far = (this->m_image_frustum).m_height * local_178;
  bVar1 = ON_IsValid(frus_far);
  if ((!bVar1) || (frus_far <= 0.0)) {
    this_local._7_1_ = false;
    local_15c = 1;
    goto LAB_007c3686;
  }
  frus_left = frus_far * 128.0;
  frus_bottom = (this->m_image_frustum).m_corners[0].x;
  i = (size_t)(this->m_image_frustum).m_corners[0].y;
  frus_top = (double)i;
  frus_right = frus_bottom;
  for (uStack_1c8 = 1; uStack_1c8 < 4; uStack_1c8 = uStack_1c8 + 1) {
    if (frus_right <= (this->m_image_frustum).m_corners[uStack_1c8].x) {
      if (frus_bottom < (this->m_image_frustum).m_corners[uStack_1c8].x) {
        frus_bottom = (this->m_image_frustum).m_corners[uStack_1c8].x;
      }
    }
    else {
      frus_right = (this->m_image_frustum).m_corners[uStack_1c8].x;
    }
    if (frus_top <= this_00->m_corners[uStack_1c8].y) {
      if ((double)i < this_00->m_corners[uStack_1c8].y) {
        i = (size_t)this_00->m_corners[uStack_1c8].y;
      }
    }
    else {
      frus_top = this_00->m_corners[uStack_1c8].y;
    }
  }
  frus_right = frus_right * local_178;
  frus_bottom = frus_bottom * local_178;
  frus_top = frus_top * local_178;
  i = (size_t)((double)i * local_178);
  vp._583_1_ = 0;
  ON_Viewport::ON_Viewport((ON_Viewport *)local_418);
  bVar1 = ON_Viewport::SetProjection((ON_Viewport *)local_418,perspective_view);
  if (bVar1) {
    ON_AerialPhotoCameraPosition::Location(&local_430,this_01);
    bVar1 = ON_Viewport::SetCameraLocation((ON_Viewport *)local_418,&local_430);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      ON_3dVector::operator-((ON_3dVector *)&bbox_near,(ON_3dVector *)&camera_plane.yaxis.z);
      bVar1 = ON_Viewport::SetCameraDirection((ON_Viewport *)local_418,(ON_3dVector *)&bbox_near);
      if ((((((bVar1 ^ 0xffU) & 1) == 0) &&
           (bVar1 = ON_Viewport::SetCameraUp
                              ((ON_Viewport *)local_418,(ON_3dVector *)&camera_plane.xaxis.z), bVar1
           )) && (bVar1 = ON_Viewport::SetFrustum
                                    ((ON_Viewport *)local_418,frus_right,frus_bottom,frus_top,
                                     (double)i,frus_far,frus_left), bVar1)) &&
         (bVar1 = ON_Viewport::SetScreenPort((ON_Viewport *)local_418,0,port_right,0,port_top,0,0),
         bVar1)) {
        bbox_far = -1.23432101234321e+308;
        local_458 = -1.23432101234321e+308;
        bVar1 = ON_Viewport::GetBoundingBoxDepth
                          ((ON_Viewport *)local_418,target_bbox,&bbox_far,&local_458,false);
        if (bVar1) {
          if (((0.0 < frus_far) && (bVar1 = ON_IsValid(bbox_far), bVar1)) && (frus_far < bbox_far))
          {
            for (max_frus_far = 1.0; max_frus_far * 2.0 * frus_far <= bbox_far;
                max_frus_far = max_frus_far * 2.0) {
            }
            if (2.0 <= max_frus_far) {
              frus_far = max_frus_far * frus_far;
              frus_right = max_frus_far * frus_right;
              frus_bottom = max_frus_far * frus_bottom;
              frus_top = max_frus_far * frus_top;
              i = (size_t)(max_frus_far * (double)i);
              frus_left = frus_far * 1.0625;
            }
          }
          bVar1 = ON_IsValid(local_458);
          if ((bVar1) && (frus_left < local_458)) {
            frus_left = local_458 * 1.0625;
            if (frus_far * 67108864.0 < local_458 * 1.0625) {
              frus_left = frus_far * 67108864.0;
            }
          }
          bVar1 = ON_Viewport::SetFrustum
                            ((ON_Viewport *)local_418,frus_right,frus_bottom,frus_top,(double)i,
                             frus_far,frus_left);
          if (!bVar1) goto LAB_007c3665;
        }
        bVar1 = ON_Viewport::IsValid((ON_Viewport *)local_418,(ON_TextLog *)0x0);
        vp._583_1_ = -bVar1 & 1;
        if (vp._583_1_ != 0) {
          ON_Viewport::operator=(viewport,(ON_Viewport *)local_418);
        }
      }
    }
  }
LAB_007c3665:
  this_local._7_1_ = (bool)(vp._583_1_ & 1);
  local_15c = 1;
  ON_Viewport::~ON_Viewport((ON_Viewport *)local_418);
LAB_007c3686:
  ON_Plane::~ON_Plane((ON_Plane *)auStack_158);
  return this_local._7_1_;
}

Assistant:

bool ON_AerialPhotoImage::GetViewProjection( 
  ON_BoundingBox target_bbox,
  ON_Viewport& viewport
  ) const
{
  viewport = ON_Viewport::DefaultTopViewYUp;

  if ( !this->ImageSizeIsSet() )
    return false;

  const int image_width_pixels   = m_image_width_pixels;
  const int image_height_pixels = m_image_height_pixels;

  const ON_AerialPhotoImageFrustum& pg_if( m_image_frustum );
  if ( !pg_if.IsSet() )
    return false;

  const ON_AerialPhotoCameraPosition& pg_cp( m_camera_position );
  if ( !pg_cp.LocationIsSet() )
    return false;
  if ( !pg_cp.OrientationIsSet() )
    return false;

  ON_3dPoint camera_location;
  if ( !pg_cp.GetLocation(camera_location) || !camera_location.IsValid() )
    return false;

  ON_Xform camera_rotation;
  if (    !pg_cp.GetOrientationRotation(camera_rotation) 
       || !camera_rotation.IsValid() 
     )
    return false;

  ON_Plane camera_plane;
  if (!pg_cp.GetOrientationFrame(camera_plane.xaxis,camera_plane.yaxis,camera_plane.zaxis))
    return false;
  camera_plane.origin = camera_location;
  camera_plane.UpdateEquation();

  const double frustum_to_position_unit_scale = ON::UnitScale( pg_if.m_unit_system, pg_cp.UnitSystem() );
  if (    !ON_IsValid(frustum_to_position_unit_scale) 
       || !(frustum_to_position_unit_scale > 0.0) 
     )
    return false;

  // The values of frus_near and frus_far are adjusted later
  // so the view's frustum contains the region in target_bbox.

  double frus_near = pg_if.m_height*frustum_to_position_unit_scale;
  if ( !ON_IsValid(frus_near) || !(frus_near > 0.0) )
    return false;

  double frus_far = 128.0*frus_near; 

  double frus_left, frus_right;
  double frus_bottom, frus_top;
  frus_left = frus_right = pg_if.m_corners[0].x;
  frus_bottom = frus_top = pg_if.m_corners[0].y;
  for ( size_t i = 1; i < sizeof(pg_if.m_corners)/sizeof(pg_if.m_corners[0]); i++ )
  {
    if ( pg_if.m_corners[i].x < frus_left )
      frus_left = pg_if.m_corners[i].x;
    else if ( pg_if.m_corners[i].x > frus_right )
      frus_right = pg_if.m_corners[i].x;
    if ( pg_if.m_corners[i].y < frus_bottom )
      frus_bottom = pg_if.m_corners[i].y;
    else if ( pg_if.m_corners[i].y > frus_top )
      frus_top = pg_if.m_corners[i].y;
  }
  frus_left   *= frustum_to_position_unit_scale;
  frus_right  *= frustum_to_position_unit_scale;
  frus_bottom *= frustum_to_position_unit_scale;
  frus_top    *= frustum_to_position_unit_scale;
  
  bool rc = false;

  ON_Viewport vp;
  for(;;)
  {
    if ( !vp.SetProjection( ON::perspective_view ) )
      break;
  
    if ( !vp.SetCameraLocation( pg_cp.Location() ) )
      break;
  
    if ( !vp.SetCameraDirection( -camera_plane.zaxis ) )
      break;
  
    if ( !vp.SetCameraUp( camera_plane.yaxis ) )
      break;

    if ( !vp.SetFrustum(frus_left,frus_right,frus_bottom,frus_top,frus_near,frus_far) )
      break;
    
    if ( !vp.SetScreenPort(0,image_width_pixels,0,image_height_pixels) )
      break;

    double bbox_near = ON_UNSET_VALUE;
    double bbox_far  = ON_UNSET_VALUE;
    if ( vp.GetBoundingBoxDepth(target_bbox,&bbox_near,&bbox_far,false) )
    {
      if ( frus_near > 0.0 && ON_IsValid(bbox_near) && frus_near < bbox_near )
      {
        double s = 1.0;
        while ( 2.0*s*frus_near <= bbox_near )
          s *= 2.0;

        if ( s >= 2.0 )
        {
          frus_near   *= s;
          frus_left   *= s;
          frus_right  *= s;
          frus_bottom *= s;
          frus_top    *= s;
          frus_far = 1.0625*frus_near;
        }
      }
            
      if ( ON_IsValid(bbox_far) && frus_far < bbox_far )
      {
        frus_far = 1.0625*bbox_far;
        const double max_frus_far = 67108864.0*frus_near; // 2^26 * frus_near
        if ( !(frus_far <= max_frus_far) )
          frus_far = max_frus_far;
      }

      if ( !vp.SetFrustum(frus_left,frus_right,frus_bottom,frus_top,frus_near,frus_far) )
        break;
    }

    rc = vp.IsValid() ? true : false;
    if ( rc )
      viewport = vp;

    break;
  }

  return rc;
}